

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markov-2.cpp
# Opt level: O1

int main(void)

{
  result_type_conflict1 rVar1;
  size_t __i;
  ostream *poVar2;
  long lVar3;
  double *pdVar4;
  pointer pdVar5;
  undefined8 *puVar6;
  size_t sVar7;
  ulong uVar8;
  uint i_6;
  int iVar9;
  double *w;
  pointer pdVar10;
  uint i;
  double dVar11;
  vector<double,_std::allocator<double>_> weights;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc;
  engine_type eng;
  metropolis local_1429;
  double local_1428;
  double local_1420;
  double local_1418;
  ulong uStack_1410;
  double local_1400;
  vector<double,_std::allocator<double>_> local_13f8;
  markov_impl<unsigned_long> local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"number of bins = ",0x11)
  ;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"number of samples = ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_13b8._M_x[0] = 0x72e3;
  lVar3 = 1;
  uVar8 = 0x72e3;
  do {
    uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar3);
    local_13b8._M_x[lVar3] = uVar8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13b8._M_p = 0x270;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar4 = (double *)operator_new(0x10);
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar4 + 2;
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  lVar3 = 0;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar4;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  do {
    dVar11 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&local_13b8);
    *(double *)((long)pdVar4 + lVar3) = (dVar11 + 0.0) * 0.001 + 1.0;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x10);
  local_1420 = 0.0;
  for (pdVar5 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 != local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    local_1420 = local_1420 + *pdVar5;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[weights]\n",10);
  pdVar5 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    pdVar10 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      poVar2 = std::ostream::_M_insert<double>(*pdVar10);
      local_13d8.dim._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13d8,1);
      pdVar10 = pdVar10 + 1;
    } while (pdVar10 != pdVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Metropolis]\n",0xd);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::metropolis,std::vector<double,std::allocator<double>>>
            (&local_13d8,&local_1429,&local_13f8);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  sVar7 = 0;
  iVar9 = 10000000;
  do {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar7),&local_13b8);
    sVar7 = (size_t)rVar1;
    puVar6[(int)rVar1] = (double)puVar6[(int)rVar1] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Metropolis (choose_next)]\n",0x1b);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  iVar9 = 10000000;
  do {
    sVar7 = bcl::metropolis::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13f8,(long)(int)sVar7,&local_13b8);
    puVar6[(int)sVar7] = (double)puVar6[(int)sVar7] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[heat bath]\n",0xc);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::heatbath,std::vector<double,std::allocator<double>>>
            (&local_13d8,(heatbath *)&local_1429,&local_13f8);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  iVar9 = 10000000;
  do {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar7),&local_13b8);
    sVar7 = (size_t)rVar1;
    puVar6[(int)rVar1] = (double)puVar6[(int)rVar1] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[heat bath (choose_next)]\n",0x1a);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  iVar9 = 10000000;
  do {
    sVar7 = bcl::heatbath::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13f8,(int)sVar7,&local_13b8);
    puVar6[(int)sVar7] = (double)puVar6[(int)sVar7] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Suwa-Todo 2010]\n",0x11);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::st2010,std::vector<double,std::allocator<double>>>
            (&local_13d8,(st2010 *)&local_1429,&local_13f8);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  iVar9 = 10000000;
  do {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar7),&local_13b8);
    sVar7 = (size_t)rVar1;
    puVar6[(int)rVar1] = (double)puVar6[(int)rVar1] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Suwa-Todo 2010 (choose_next)]\n",0x1f);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  iVar9 = 10000000;
  do {
    sVar7 = bcl::st2010::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13f8,(long)(int)sVar7,&local_13b8);
    puVar6[(int)sVar7] = (double)puVar6[(int)sVar7] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Suwa-Todo 2013]\n",0x11);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::st2013,std::vector<double,std::allocator<double>>>
            (&local_13d8,(st2013 *)&local_1429,&local_13f8);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = 0;
  puVar6[1] = 0;
  iVar9 = 10000000;
  do {
    rVar1 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar7),&local_13b8);
    sVar7 = (size_t)rVar1;
    puVar6[(int)rVar1] = (double)puVar6[(int)rVar1] + 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar3 = 0;
  do {
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    uStack_1410 = 0;
    dVar11 = (double)puVar6[lVar3];
    local_1400 = dVar11 / -10000000.0;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_1428 = dVar11 / 10000000.0;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar3] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>((double)puVar6[lVar3] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar2 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    \t",5);
    poVar2 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  operator_delete(puVar6,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  if (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;
  std::cout << "number of samples = " << samples << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = 1.0 + 0.001 * dist(eng);
  double total = std::accumulate(weights.begin(), weights.end(), 0.0);
  std::cout << "[weights]\n";
  for (auto& w : weights) std::cout << w << ' ';
  std::cout << std::endl;

  // generate markov chain
  int x = 0;
  {
    std::cout << "[Metropolis]\n";
    bcl::markov<engine_type> mc(bcl::metropolis(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Metropolis (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::metropolis::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath]\n";
    bcl::markov<engine_type> mc(bcl::heatbath(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::heatbath::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010]\n";
    bcl::markov<engine_type> mc(bcl::st2010(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010 (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::st2010::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2013]\n";
    bcl::markov<engine_type> mc(bcl::st2013(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}